

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webserver.c
# Opt level: O2

char * StrStr(char *s1,char *s2)

{
  char *s;
  char *s_00;
  char *pcVar1;
  char *pcVar2;
  
  s = strdup(s1);
  if (s == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    s_00 = strdup(s2);
    if (s_00 == (char *)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      ToUpperCase(s);
      ToUpperCase(s_00);
      pcVar1 = strstr(s,s_00);
      pcVar2 = s1 + ((long)pcVar1 - (long)s);
      if (pcVar1 == (char *)0x0) {
        pcVar2 = (char *)0x0;
      }
      free(s_00);
    }
    free(s);
  }
  return pcVar2;
}

Assistant:

static char *StrStr(
	/*! Input string. */
	char *s1,
	/*! Input sub-string. */
	const char *s2)
{
	char *Str1;
	char *Str2;
	const char *Ptr;
	char *ret = NULL;

	Str1 = strdup(s1);
	if (!Str1)
		goto error1;
	Str2 = strdup(s2);
	if (!Str2)
		goto error2;
	ToUpperCase(Str1);
	ToUpperCase(Str2);
	Ptr = strstr(Str1, Str2);
	if (!Ptr)
		ret = NULL;
	else
		ret = s1 + (Ptr - Str1);

	free(Str2);
error2:
	free(Str1);
error1:
	return ret;
}